

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

ssize_t __thiscall icu_63::VTZReader::read(VTZReader *this,int __fd,void *__buf,size_t __nbytes)

{
  short sVar1;
  uint uVar2;
  UnicodeString *pUVar3;
  uint uVar4;
  ulong uVar5;
  char16_t *pcVar6;
  
  uVar2 = this->index;
  pUVar3 = this->in;
  sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (pUVar3->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  uVar5 = CONCAT62((uint6)(ushort)(uVar4 >> 0x10),0xffff);
  if (uVar2 < uVar4 && (int)uVar2 < (int)uVar4) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar6 = (pUVar3->fUnion).fFields.fArray;
    }
    else {
      pcVar6 = (char16_t *)((long)&pUVar3->fUnion + 2);
    }
    uVar5 = (ulong)(ushort)pcVar6[(int)uVar2];
  }
  this->index = uVar2 + 1;
  return uVar5;
}

Assistant:

UChar
VTZReader::read(void) {
    UChar ch = 0xFFFF;
    if (index < in->length()) {
        ch = in->charAt(index);
    }
    index++;
    return ch;
}